

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_timer.cpp
# Opt level: O2

void kokkosp_pop_profile_region(void)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  
  uVar1 = KokkosTools::KernelTimer::current_region_level - 1;
  if ((int)KokkosTools::KernelTimer::current_region_level < 1) {
    KokkosTools::KernelTimer::current_region_level = 0;
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "WARNING:: Kokkos::Profiling::popRegion() called outside ");
    std::operator<<(poVar2," of an actve region. Previous regions: ");
    for (lVar4 = 0; (lVar4 != 5 && ((&KokkosTools::KernelTimer::regions)[lVar4] != 0));
        lVar4 = lVar4 + 1) {
      pcVar3 = ";";
      if (lVar4 == 0) {
        pcVar3 = " ";
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,pcVar3);
      std::operator<<(poVar2,(string *)(&KokkosTools::KernelTimer::regions)[lVar4]);
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    return;
  }
  KokkosTools::KernelTimer::current_region_level = uVar1;
  KokkosTools::KernelTimer::KernelPerformanceInfo::addFromTimer
            ((KernelPerformanceInfo *)(&KokkosTools::KernelTimer::regions)[uVar1]);
  return;
}

Assistant:

void kokkosp_pop_profile_region() {
  current_region_level--;

  // current_region_level is out of bounds, inform the user they
  // called popRegion too many times.
  if (current_region_level < 0) {
    current_region_level = 0;
    std::cerr << "WARNING:: Kokkos::Profiling::popRegion() called outside "
              << " of an actve region. Previous regions: ";

    /* This code block will walk back through the non-null regions
     * pointers and print the names.  This takes advantage of a slight
     * issue with regions logic: we never actually delete the
     * KernelPerformanceInfo objects.  If that ever changes this needs
     * to be updated.
     */
    for (int i = 0; i < 5; i++) {
      if (regions[i] != 0) {
        std::cerr << (i == 0 ? " " : ";") << regions[i]->getName();
      } else {
        break;
      }
    }
    std::cerr << "\n";
  } else {
    // don't call addFromTimer if we are outside an active region
    regions[current_region_level]->addFromTimer();
  }
}